

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O2

void RtAudio::getCompiledApi(vector<RtAudio::Api,_std::allocator<RtAudio::Api>_> *apis)

{
  allocator_type local_29;
  vector<RtAudio::Api,std::allocator<RtAudio::Api>> local_28 [24];
  
  std::vector<RtAudio::Api,std::allocator<RtAudio::Api>>::vector<RtAudio::Api_const*,void>
            (local_28,rtaudio_compiled_apis,rtaudio_compiled_apis + 2,&local_29);
  std::vector<RtAudio::Api,_std::allocator<RtAudio::Api>_>::_M_move_assign(apis,local_28);
  std::_Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>::~_Vector_base
            ((_Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_> *)local_28);
  return;
}

Assistant:

void RtAudio :: getCompiledApi( std::vector<RtAudio::Api> &apis )
{
  apis = std::vector<RtAudio::Api>(rtaudio_compiled_apis,
                                   rtaudio_compiled_apis + rtaudio_num_compiled_apis);
}